

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::setCOMConstraintProjectionDirection
          (InverseKinematics *this,Span<const_double,__1L> direction)

{
  index_type iVar1;
  bool ok;
  int expected_pos_size;
  bool local_1;
  
  iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x16b8e5);
  if (iVar1 == 3) {
    local_1 = missingIpoptErrorReport();
  }
  else {
    iDynTree::reportError
              ("InverseKinematics","setCOMConstraintProjectionDirection",
               "Wrong size in input direction");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InverseKinematics::setCOMConstraintProjectionDirection(iDynTree::Span<const double> direction)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (direction.size() == expected_pos_size);
        if( !ok )
        {
            reportError("InverseKinematics",
                        "setCOMConstraintProjectionDirection",
                        "Wrong size in input direction");
            return false;
        }

#ifdef IDYNTREE_USES_IPOPT
        // define the projection matrix 'Pdirection' in the class 'ConvexHullProjectionConstraint'
        IK_PIMPL(m_pimpl)->m_comHullConstraint_projDirection = direction;
        IK_PIMPL(m_pimpl)->m_comHullConstraint.setProjectionAlongDirection(direction);

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }